

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_signparameter.cpp
# Opt level: O2

void __thiscall
SignParameter_DefaultConstructorTest_Test::TestBody(SignParameter_DefaultConstructorTest_Test *this)

{
  ByteData *in_stack_ffffffffffffff20;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  undefined1 local_c0 [40];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  SignParameter sign_parameter;
  
  cfd::SignParameter::SignParameter(&sign_parameter);
  cfd::core::ByteData::ByteData((ByteData *)local_c0);
  cfd::core::Pubkey::Pubkey((Pubkey *)&local_d8);
  cfd::core::SigHashType::SigHashType((SigHashType *)(local_c0 + 0x1c));
  cfd::core::ByteData::ByteData((ByteData *)&local_98);
  anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&sign_parameter,(SignParameter *)local_c0,(ByteData *)0x1,
             (SignDataType)&local_d8,(Pubkey *)0x0,(bool)((char)local_c0 + '\x1c'),
             (SigHashType *)&local_98,in_stack_ffffffffffffff20);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_98);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_d8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0);
  cfd::SignParameter::~SignParameter(&sign_parameter);
  return;
}

Assistant:

TEST(SignParameter, DefaultConstructorTest)
{
  // default constructor
  SignParameter sign_parameter = SignParameter();
  CompareSignparameter(sign_parameter, ByteData(), SignDataType::kBinary,
      Pubkey(), false, SigHashType(), ByteData());
}